

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IM_Command.h
# Opt level: O0

void __thiscall nigel::IM_Block::IM_Block(IM_Block *this,String *symbol,bool begin)

{
  bool begin_local;
  String *symbol_local;
  IM_Block *this_local;
  
  IM_Operator::IM_Operator(&this->super_IM_Operator,block);
  (this->super_IM_Operator)._vptr_IM_Operator = (_func_int **)&PTR__IM_Block_002b6418;
  *(undefined4 *)&(this->super_IM_Operator).field_0x1c = 0;
  std::__cxx11::string::string((string *)&this->symbol);
  this->begin = false;
  this->finish = false;
  std::__cxx11::string::operator=((string *)&this->symbol,(string *)symbol);
  this->begin = begin;
  return;
}

Assistant:

IM_Block( String symbol, bool begin ) : IM_Operator( IM_Operator::Type::block )
		{
			this->symbol = symbol;
			this->begin = begin;
		}